

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void lemma35(void)

{
  return;
}

Assistant:

void lemma35()
{
	 /* Since by making S conformal we did not remove any exit chord, it is still the case that, as observed in the proof of Lemma 3.2, no arc has more than γ2 edges.
	 * Therefore, S is conformal and γ2-semigranular.  We must now check whether the second citerion for γ2-granularity holds.  This criterion says that contracting any edge of the submap
	 * tree that is incident upon at least one node of degree less than 3 produces a new node whose weight exceeds γ2.  This is very easy to enforce: if an edge does not pass the test,
	 * we just contract it by removing its corresponding exit chord (and those endpoints that are not vertices of ∂C).  Note that this will not cause a violation of the first criterion,
	 * since the size of all the arcs will always remain within γ2.  Similarly, the removal keeps the submap conformal.  We process each exit chord in turn and check whether it is removable.
	 * Chords need be processed only once since the removals cannot make any chord removable if it was not already so before.  Therefore, γ2-granularity, and more generally γ-granularity,
	 * for any γ >= γ2, can be enforced in this nondetermininistic fashion in time linear in the size of the submap tree, that is, O(n1/γ1 + n2/γ2 + 1).  We can now put S in normal form,
	 * which includes computing its tree decomposition.  As we discussed earlier, this can be done very simply in time O((n1/γ1 + n2/γ2 + 1)log(n1+n2)).  With the inconsequential assumption that
	 * γi = O(n1+n2), we derive the following result from Lemmas 3.1 and 3.4 */
}